

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O1

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  int in_ESI;
  uv_idle_t *puVar2;
  uv_udp_send_t *puVar3;
  
  if (send_req.handle == (uv_udp_t *)0x0) {
    puVar3 = (uv_udp_send_t *)handle;
    if (handle != &idle_handle) goto LAB_0018a978;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_stop();
    puVar3 = (uv_udp_send_t *)puVar2;
    if (iVar1 != 0) goto LAB_0018a97d;
    if (999 < loop_hang_called) {
      loop_hang_called = loop_hang_called + 1;
      uv_close(&client,0);
      uv_close(&idle_handle,0);
      return;
    }
    puVar3 = &send_req;
    in_ESI = 0x59ff58;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puVar3 = (uv_udp_send_t *)send_req.handle;
    idle_cb_cold_1();
LAB_0018a978:
    idle_cb_cold_2();
LAB_0018a97d:
    idle_cb_cold_3();
  }
  idle_cb_cold_4();
  if (puVar3 == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
    puVar2 = (uv_idle_t *)puVar3;
LAB_0018a9d5:
    send_cb_cold_1();
LAB_0018a9da:
    send_cb_cold_2();
  }
  else {
    if ((in_ESI != -0x65) && (in_ESI != 0)) goto LAB_0018a9e4;
    puVar2 = (uv_idle_t *)puVar3;
    if (puVar3->handle != &client) goto LAB_0018a9d5;
    if (puVar3 != &send_req) goto LAB_0018a9da;
    send_req.handle = (uv_udp_t *)0x0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  send_cb_cold_3();
  puVar3 = (uv_udp_send_t *)puVar2;
LAB_0018a9e4:
  send_cb_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar3,0);
  return;
}

Assistant:

static void idle_cb(uv_idle_t* idle) {
  uv_sleep(100);
  if (++ticks < kMaxTicks)
    return;

  uv_poll_stop(&poll_req[0]);
  uv_poll_stop(&poll_req[1]);
  uv_close((uv_handle_t*) &server_handle, NULL);
  uv_close((uv_handle_t*) &client_handle, NULL);
  uv_close((uv_handle_t*) &peer_handle, NULL);
  uv_close((uv_handle_t*) idle, NULL);
}